

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedBreakIterator::adoptText(RuleBasedBreakIterator *this,CharacterIterator *newText)

{
  CharacterIterator *pCVar1;
  uint in_EAX;
  UErrorCode status;
  undefined8 uStack_18;
  
  pCVar1 = this->fCharIter;
  uStack_18._0_4_ = in_EAX;
  if (pCVar1 != (CharacterIterator *)0x0 && (StringCharacterIterator *)pCVar1 != &this->fSCharIter)
  {
    (*(pCVar1->super_ForwardCharacterIterator).super_UObject._vptr_UObject[1])();
  }
  this->fCharIter = newText;
  uStack_18 = (ulong)(uint)uStack_18;
  BreakCache::reset(this->fBreakCache,0,0);
  DictionaryCache::reset(this->fDictionaryCache);
  if ((newText == (CharacterIterator *)0x0) || (newText->begin != 0)) {
    utext_openUChars_63(&this->fText,(UChar *)0x0,0,(UErrorCode *)((long)&uStack_18 + 4));
  }
  else {
    utext_openCharacterIterator_63(&this->fText,newText,(UErrorCode *)((long)&uStack_18 + 4));
  }
  (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])(this);
  return;
}

Assistant:

void
RuleBasedBreakIterator::adoptText(CharacterIterator* newText) {
    // If we are holding a CharacterIterator adopted from a
    //   previous call to this function, delete it now.
    if (fCharIter != &fSCharIter) {
        delete fCharIter;
    }

    fCharIter = newText;
    UErrorCode status = U_ZERO_ERROR;
    fBreakCache->reset();
    fDictionaryCache->reset();
    if (newText==NULL || newText->startIndex() != 0) {
        // startIndex !=0 wants to be an error, but there's no way to report it.
        // Make the iterator text be an empty string.
        utext_openUChars(&fText, NULL, 0, &status);
    } else {
        utext_openCharacterIterator(&fText, newText, &status);
    }
    this->first();
}